

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int walkerParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  long lVar2;
  xmlTextReaderPtr reader;
  int in_R9D;
  
  lVar2 = xmlReadFile(filename,0,options | 0x40);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to parse %s\n",filename);
    iVar1 = -1;
  }
  else {
    reader = (xmlTextReaderPtr)xmlReaderWalker(lVar2);
    iVar1 = streamProcessTest(filename,result,err,reader,(char *)0x0,in_R9D);
    xmlFreeTextReader(reader);
    xmlFreeDoc(lVar2);
  }
  return iVar1;
}

Assistant:

static int
walkerParseTest(const char *filename, const char *result, const char *err,
                int options) {
    xmlDocPtr doc;
    xmlTextReaderPtr reader;
    int ret;

    doc = xmlReadFile(filename, NULL, options | XML_PARSE_NOWARNING);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
    reader = xmlReaderWalker(doc);
    ret = streamProcessTest(filename, result, err, reader, NULL, options);
    xmlFreeTextReader(reader);
    xmlFreeDoc(doc);
    return(ret);
}